

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::enum_case_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_enum_value *tenum_case,
          bool declaration)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&tenum_case->name_);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  if (declaration) {
    maybe_escape_identifier(&local_50,this,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::enum_case_name(t_enum_value* tenum_case, bool declaration) {
  string name = tenum_case->get_name();
  // force to lowercase for Swift style, maybe escape if its a keyword
  std::transform(name.begin(), name.end(), name.begin(), ::tolower);
  if (declaration) {
    name = maybe_escape_identifier(name);
  }
  return name;
}